

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntLoadConstraint_C
          (ChLinkMotorLinearDriveline *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined7 in_register_00000009;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar18 [16];
  
  ChLinkMateGeneric::IntLoadConstraint_C
            ((ChLinkMateGeneric *)this,off_L,Qc,c,do_clamp,recovery_clamp);
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  dVar12 = (double)(**(code **)(*(long *)&(this->super_ChLinkMotorLinear).super_ChLinkMotor.
                                          super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                          super_ChLinkBase.super_ChPhysicsItem + 600))(this);
  dVar12 = (dVar12 - *(double *)(*(long *)&(this->super_ChLinkMotorLinear).field_0x278 + 0x88)) * c;
  if ((int)CONCAT71(in_register_00000009,do_clamp) != 0) {
    auVar8._8_8_ = in_XMM1_Qb;
    auVar8._0_8_ = recovery_clamp;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar8,auVar11);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    auVar11 = vmaxsd_avx(auVar13,auVar11);
    auVar11 = vminsd_avx(auVar11,auVar8);
    dVar12 = auVar11._0_8_;
  }
  auVar18._8_8_ = in_XMM1_Qb;
  auVar18._0_8_ = recovery_clamp;
  uVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar10 = iVar1 + off_L;
  uVar9 = (ulong)uVar10;
  if ((long)uVar9 < (long)uVar2) {
    pdVar3 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar3[uVar9] = dVar12 + pdVar3[uVar9];
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         ((this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->pos;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar14,auVar4);
    dVar12 = auVar11._0_8_ * c;
    if (do_clamp) {
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar11 = vxorpd_avx512vl(auVar18,auVar5);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar12;
      auVar11 = vmaxsd_avx(auVar15,auVar11);
      auVar11 = vminsd_avx(auVar11,auVar18);
      dVar12 = auVar11._0_8_;
    }
    uVar9 = (ulong)(uVar10 + 1);
    if (uVar9 < uVar2) {
      pdVar3[uVar9] = dVar12 + pdVar3[uVar9];
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           ((this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->pos;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar11 = vxorpd_avx512vl(auVar16,auVar6);
      dVar12 = auVar11._0_8_ * c;
      if (do_clamp) {
        auVar7._8_8_ = 0x8000000000000000;
        auVar7._0_8_ = 0x8000000000000000;
        auVar11 = vxorpd_avx512vl(auVar18,auVar7);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar12;
        auVar11 = vmaxsd_avx(auVar17,auVar11);
        auVar11 = vminsd_avx(auVar11,auVar18);
        dVar12 = auVar11._0_8_;
      }
      uVar9 = (ulong)(uVar10 + 2);
      if (uVar9 < uVar2) {
        pdVar3[uVar9] = dVar12 + pdVar3[uVar9];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkMotorLinearDriveline::IntLoadConstraint_C(const unsigned int off_L,
                                       ChVectorDynamic<>& Qc,
                                       const double c,
                                       bool do_clamp,
                                       double recovery_clamp) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntLoadConstraint_C(off_L, Qc, c, do_clamp, recovery_clamp);

    int nc = mask.nconstr;

    // compute custom violation C:
    double cnstr_pos_error1 =  this->GetMotorPos() - (this->innershaft1lin->GetPos());// - this->innershaft2lin->GetPos());
    double cnstr_violation1 = c * cnstr_pos_error1;
    if (do_clamp)
        cnstr_violation1 = ChMin(ChMax(cnstr_violation1, -recovery_clamp), recovery_clamp);
    Qc(off_L + nc + 0) += cnstr_violation1;

    // Always drive inner linear shaft 2 to zero
    // (hack! this is not exact if also the guide, part 2, moves fast?)
    double cnstr_violation2 = c * -this->innershaft2lin->GetPos();
    if (do_clamp)
        cnstr_violation2 = ChMin(ChMax(cnstr_violation2, -recovery_clamp), recovery_clamp);
    Qc(off_L + nc + 1) += cnstr_violation2;

    // Always drive inner rotational shaft 2 to zero
    // (hack! this is not exact if also the guide, part 2, rotates fast?)
    double cnstr_violation2r = c * -innershaft2rot->GetPos();
    if (do_clamp)
        cnstr_violation2r = ChMin(ChMax(cnstr_violation2r, -recovery_clamp), recovery_clamp);
    Qc(off_L + nc + 2) += cnstr_violation2r;

}